

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

void __thiscall
nlohmann::json_abi_v3_11_3::
basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
::basic_json(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
             *this,basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                   *other)

{
  undefined1 *in_RSI;
  json_value *in_RDI;
  json_value *this_00;
  json_value local_60;
  json_value local_58;
  json_value local_50;
  json_value local_48;
  json_value local_40;
  json_value local_38;
  json_value local_30;
  json_value local_18;
  undefined1 *local_10;
  
  in_RDI->object = (object_t *)0x0;
  in_RDI[1].object = (object_t *)0x0;
  this_00 = in_RDI;
  local_10 = in_RSI;
  data::data((data *)0x1f0f4a);
  this_00->boolean = (boolean_t)*local_10;
  assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)this_00,SUB81((ulong)in_RDI >> 0x38,0));
  switch(this_00->boolean) {
  case false:
  case true:
    break;
  case true:
    json_value::json_value(this_00,(object_t *)in_RDI);
    in_RDI[1] = local_18;
    break;
  case true:
    json_value::json_value(this_00,(array_t *)in_RDI);
    in_RDI[1] = local_30;
    break;
  case true:
    json_value::json_value(this_00,(string_t *)in_RDI);
    in_RDI[1] = local_38;
    break;
  case true:
    json_value::json_value((json_value *)&local_40.boolean,(boolean_t)(local_10[8] & 1));
    in_RDI[1] = local_40;
    break;
  case true:
    json_value::json_value((json_value *)&local_48.boolean,*(number_integer_t *)(local_10 + 8));
    in_RDI[1] = local_48;
    break;
  case true:
    json_value::json_value((json_value *)&local_50.boolean,*(number_unsigned_t *)(local_10 + 8));
    in_RDI[1] = local_50;
    break;
  case true:
    json_value::json_value((json_value *)&local_58.boolean,*(number_float_t *)(local_10 + 8));
    in_RDI[1] = local_58;
    break;
  case true:
    json_value::json_value(this_00,(binary_t *)in_RDI);
    in_RDI[1] = local_60;
  }
  set_parents((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
               *)in_RDI);
  assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)this_00,SUB81((ulong)in_RDI >> 0x38,0));
  return;
}

Assistant:

basic_json(const basic_json& other)
        : json_base_class_t(other)
    {
        m_data.m_type = other.m_data.m_type;
        // check of passed value is valid
        other.assert_invariant();

        switch (m_data.m_type)
        {
            case value_t::object:
            {
                m_data.m_value = *other.m_data.m_value.object;
                break;
            }

            case value_t::array:
            {
                m_data.m_value = *other.m_data.m_value.array;
                break;
            }

            case value_t::string:
            {
                m_data.m_value = *other.m_data.m_value.string;
                break;
            }

            case value_t::boolean:
            {
                m_data.m_value = other.m_data.m_value.boolean;
                break;
            }

            case value_t::number_integer:
            {
                m_data.m_value = other.m_data.m_value.number_integer;
                break;
            }

            case value_t::number_unsigned:
            {
                m_data.m_value = other.m_data.m_value.number_unsigned;
                break;
            }

            case value_t::number_float:
            {
                m_data.m_value = other.m_data.m_value.number_float;
                break;
            }

            case value_t::binary:
            {
                m_data.m_value = *other.m_data.m_value.binary;
                break;
            }

            case value_t::null:
            case value_t::discarded:
            default:
                break;
        }

        set_parents();
        assert_invariant();
    }